

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_35::InMemoryDirectory::EntryImpl::init(EntryImpl *this,EVP_PKEY_CTX *ctx)

{
  DirectoryNode *pDVar1;
  int in_ECX;
  DirectoryNode *in_RDX;
  void *__child_stack;
  void *in_R8;
  
  pDVar1 = OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
           ::
           init<kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode>
                     ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       *)(ctx + 0x18),in_RDX);
  Directory::clone((Directory *)this,(__fn *)(pDVar1->directory).ptr,__child_stack,in_ECX,in_R8);
  return (int)this;
}

Assistant:

Own<const Directory> init(DirectoryNode&& value) {
      return node.init<DirectoryNode>(kj::mv(value)).directory->clone();
    }